

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::
ExpressionLhs<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&>
::
captureExpression<(Catch::Internal::Operator)0,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (ExpressionLhs<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&>
           *this,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *rhs)

{
  ResultBuilder *pRVar1;
  long lVar2;
  bool bVar3;
  OfType OVar4;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pRVar1 = *(ResultBuilder **)this;
  lVar2 = *(long *)(this + 8);
  OVar4 = ExpressionFailed;
  if (*(size_t *)(lVar2 + 0x28) == (rhs->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      (*(_Base_ptr *)(lVar2 + 0x18),(_Base_ptr)(lVar2 + 8),
                       (rhs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
    OVar4 = ExpressionFailed;
    if (bVar3) {
      OVar4 = Ok;
    }
  }
  (pRVar1->m_data).resultType = OVar4;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,Detail::unprintableString_abi_cxx11_,
             DAT_00184790 + Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,Detail::unprintableString_abi_cxx11_,
             DAT_00184790 + Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }